

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

bool __thiscall
FWeaponSlots::LocateWeapon(FWeaponSlots *this,PClassWeapon *type,int *slot,int *index)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  WeaponInfo *pWVar4;
  bool bVar5;
  
  bVar5 = true;
  uVar1 = 0;
  do {
    uVar3 = (ulong)this->Slots[uVar1].Weapons.Count;
    if (uVar3 != 0) {
      pWVar4 = this->Slots[uVar1].Weapons.Array;
      uVar2 = 0;
      do {
        if (pWVar4->Type == type) {
          if (-1 < (int)uVar2) {
            if (slot != (int *)0x0) {
              *slot = (int)uVar1;
            }
            if (index == (int *)0x0) {
              return bVar5;
            }
            *index = (int)uVar2;
            return bVar5;
          }
          break;
        }
        uVar2 = uVar2 + 1;
        pWVar4 = pWVar4 + 1;
      } while (uVar3 != uVar2);
    }
    bVar5 = uVar1 < 9;
    uVar1 = uVar1 + 1;
    if (uVar1 == 10) {
      return false;
    }
  } while( true );
}

Assistant:

bool FWeaponSlots::LocateWeapon (PClassWeapon *type, int *const slot, int *const index)
{
	int i, j;

	for (i = 0; i < NUM_WEAPON_SLOTS; i++)
	{
		j = Slots[i].LocateWeapon(type);
		if (j >= 0)
		{
			if (slot != NULL) *slot = i;
			if (index != NULL) *index = j;
			return true;
		}
	}
	return false;
}